

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::set_bit
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int pos)

{
  if ((-1 < pos) && (pos < this->data_capacity_)) {
    this->bitmap_[(uint)pos >> 6] = this->bitmap_[(uint)pos >> 6] | 1L << ((ulong)(uint)pos & 0x3f);
    return;
  }
  __assert_fail("pos >= 0 && pos < data_capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex_nodes.h"
                ,0x1e4,
                "void alex::AlexDataNode<int, int>::set_bit(int) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
               );
}

Assistant:

inline void set_bit(int pos) {
    assert(pos >= 0 && pos < data_capacity_);
    int bitmap_pos = pos >> 6;
    int bit_pos = pos - (bitmap_pos << 6);
    bitmap_[bitmap_pos] |= (1ULL << bit_pos);
  }